

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

RpcValue __thiscall
miniros::master::Master::searchParam(Master *this,string *caller_id,string *key,Connection *param_4)

{
  ulong uVar1;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  XmlRpcValue *in_RSI;
  XmlRpcValue *in_RDI;
  RpcValue RVar2;
  string foundKey;
  RpcValue *res;
  string *in_stack_00000168;
  string *in_stack_00000170;
  ParameterStorage *in_stack_00000178;
  undefined8 in_stack_ffffffffffffff48;
  int i;
  XmlRpcValue *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff68;
  XmlRpcValue *rhs;
  XmlRpcValue *in_stack_ffffffffffffff88;
  XmlRpcValue *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa8;
  XmlRpcValue *in_stack_ffffffffffffffb0;
  
  i = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  rhs = in_RDI;
  XmlRpc::XmlRpcValue::Array((int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  ParameterStorage::searchParam(in_stack_00000178,in_stack_00000170,in_stack_00000168);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    in_stack_ffffffffffffff68 =
         (string *)XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff50,i);
    XmlRpc::XmlRpcValue::operator=(in_RSI,(int *)rhs);
    XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff50,i);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff50,i);
    XmlRpc::XmlRpcValue::operator=(in_RSI,(int *)rhs);
    in_stack_ffffffffffffff50 = XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff50,i);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  XmlRpc::XmlRpcValue::XmlRpcValue(in_RDI,in_stack_ffffffffffffff68);
  XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff50,i);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52ca65);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  RVar2._value.asDouble = extraout_RDX.asDouble;
  RVar2._0_8_ = rhs;
  return RVar2;
}

Assistant:

Master::RpcValue Master::searchParam(const std::string& caller_id, const std::string& key, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  std::string foundKey = m_parameterStorage.searchParam(caller_id, key);
  if (!foundKey.empty()) {
    res[0] = 1;
    res[1] = "searchParam success";
  } else {
    res[0] = 0;
    res[1] = "searchParam param not found";
  }
  res[2] = foundKey;
  return res;
}